

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

Input * __thiscall
helics::ValueFederate::registerSubscription
          (ValueFederate *this,string_view target,string_view units)

{
  string_view target_00;
  Input *pIVar1;
  Input *in_R8;
  ValueFederateManager *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  undefined1 in_stack_00000078 [16];
  string_view in_stack_00000090;
  Input *inp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined1 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  __sv_type local_70;
  undefined1 local_60 [32];
  __sv_type local_40;
  Input *local_30;
  Input *pIStack_18;
  
  pIStack_18 = in_R8;
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                *)0x283670);
  puVar2 = local_60;
  std::__cxx11::string::string(in_stack_ffffffffffffff20);
  local_40 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
  this_00 = &local_90;
  std::__cxx11::string::string(this_00);
  local_70 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff10);
  pIVar1 = ValueFederateManager::registerInput
                     (in_stack_00000060,(string_view)in_stack_00000078,
                      (string_view)in_stack_00000068,in_stack_00000090);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_18);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_18);
  target_00._M_str = (char *)this_00;
  target_00._M_len = (size_t)puVar2;
  local_30 = pIVar1;
  Input::addTarget(pIStack_18,target_00);
  return local_30;
}

Assistant:

Input& ValueFederate::registerSubscription(std::string_view target, std::string_view units)
{
    auto& inp = vfManager->registerInput(std::string{}, std::string{}, units);
    inp.addTarget(target);
    return inp;
}